

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml.cpp
# Opt level: O3

void __thiscall TiXmlText::CopyTo(TiXmlText *this,TiXmlText *target)

{
  size_t len;
  char *__s;
  
  __s = ((this->super_TiXmlNode).value.rep_)->str;
  len = strlen(__s);
  TiXmlString::assign(&(target->super_TiXmlNode).value,__s,len);
  (target->super_TiXmlNode).super_TiXmlBase.userData =
       (this->super_TiXmlNode).super_TiXmlBase.userData;
  (target->super_TiXmlNode).super_TiXmlBase.location =
       (this->super_TiXmlNode).super_TiXmlBase.location;
  target->cdata = this->cdata;
  return;
}

Assistant:

void TiXmlText::CopyTo( TiXmlText* target ) const
{
	TiXmlNode::CopyTo( target );
	target->cdata = cdata;
}